

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexchange.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  int iVar2;
  function<bool_(int,_const_diy::Master_&)> *this;
  time_t tVar3;
  size_type sVar4;
  reference pvVar5;
  Master *this_00;
  Block *this_01;
  bool remote;
  int i_1;
  int num_iters;
  BlockID neighbor;
  Link *link;
  int gid;
  size_t i;
  vector<int,_std::allocator<int>_> gids;
  RoundRobinAssigner assigner;
  Master master;
  int mem_blocks;
  int threads;
  int nblocks;
  FileStorage storage;
  communicator world;
  environment env;
  size_t in_stack_ffffffffffffe598;
  BlockID *block;
  communicator *in_stack_ffffffffffffe5a0;
  Master *this_02;
  _func_void_void_ptr_BinaryBuffer_ptr **in_stack_ffffffffffffe5a8;
  NeverSkip *__f;
  function<void_(void_*,_diy::BinaryBuffer_&)> *in_stack_ffffffffffffe5b0;
  undefined8 in_stack_ffffffffffffe5b8;
  int iVar6;
  RoundRobinAssigner *in_stack_ffffffffffffe5c0;
  Skip *in_stack_ffffffffffffe5d0;
  undefined4 in_stack_ffffffffffffe5d8;
  undefined4 in_stack_ffffffffffffe5dc;
  Master *in_stack_ffffffffffffe5e0;
  string *in_stack_ffffffffffffe5e8;
  FileStorage *in_stack_ffffffffffffe5f0;
  undefined4 in_stack_ffffffffffffe608;
  value_type vVar7;
  int in_stack_ffffffffffffe61c;
  Skip local_19a0;
  code *in_stack_ffffffffffffe680;
  pointer in_stack_ffffffffffffe688;
  undefined1 remote_00;
  Master *in_stack_ffffffffffffe690;
  string local_1910;
  undefined8 local_18f0;
  undefined1 local_18e0 [40];
  pointer local_18b8;
  _Base_ptr p_Stack_18b0;
  _Base_ptr local_18a8;
  __native_type _Stack_18a0;
  pointer local_1878;
  pointer piStack_1870;
  pointer local_1868;
  _Rb_tree_impl<std::less<int>,_true> _Stack_1860;
  code *local_1830;
  int local_1828;
  int local_1824;
  int local_1820;
  int local_181c;
  DIY_MPI_Comm local_1818;
  value_type local_180c;
  ulong local_1808;
  vector<int,_std::allocator<int>_> local_1800;
  undefined1 local_17e8 [16];
  code *local_17d8;
  NeverSkip local_17d0 [32];
  code *local_17b0;
  undefined1 local_17a8 [72];
  code *local_1760;
  communicator local_1738 [237];
  undefined4 local_f0;
  undefined4 local_ec;
  int local_e8;
  allocator<char> local_e1;
  string local_e0 [32];
  BlockID local_c0 [18];
  communicator local_30;
  int local_4;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffe5b8 >> 0x20);
  local_4 = 0;
  diy::mpi::environment::environment
            ((environment *)in_stack_ffffffffffffe5a0,(int)(in_stack_ffffffffffffe598 >> 0x20),
             (char **)0x10dbcd);
  diy::mpi::communicator::communicator(in_stack_ffffffffffffe5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe5e0,
             (char *)CONCAT44(in_stack_ffffffffffffe5dc,in_stack_ffffffffffffe5d8),
             (allocator<char> *)in_stack_ffffffffffffe5d0);
  diy::FileStorage::FileStorage(in_stack_ffffffffffffe5f0,in_stack_ffffffffffffe5e8);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  local_e8 = diy::mpi::communicator::size(&local_30);
  local_e8 = local_e8 * 0x18;
  local_ec = 2;
  local_f0 = 0xffffffff;
  diy::mpi::communicator::communicator(local_1738,&local_30);
  local_1760 = create_block;
  std::function<void*()>::function<void*(*)(),void>
            ((function<void_*()> *)in_stack_ffffffffffffe5b0,
             (_func_void_ptr **)in_stack_ffffffffffffe5a8);
  local_17a8._32_8_ = destroy_block;
  std::function<void(void*)>::function<void(*)(void*),void>
            ((function<void_(void_*)> *)in_stack_ffffffffffffe5b0,
             (_func_void_void_ptr **)in_stack_ffffffffffffe5a8);
  local_17b0 = save_block;
  std::function<void(void_const*,diy::BinaryBuffer&)>::
  function<void(*)(void_const*,diy::BinaryBuffer&),void>
            ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe5b0,
             in_stack_ffffffffffffe5a8);
  local_17d8 = load_block;
  std::function<void(void*,diy::BinaryBuffer&)>::function<void(*)(void*,diy::BinaryBuffer&),void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  this = (function<bool_(int,_const_diy::Master_&)> *)operator_new(0x10);
  diy::Master::QueueSizePolicy::QueueSizePolicy
            ((QueueSizePolicy *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  __f = local_17d0;
  this_02 = (Master *)local_17a8;
  block = local_c0;
  diy::Master::Master((Master *)master.mt_gen._M_x[0x10a],(communicator *)master.mt_gen._M_x[0x109],
                      master.mt_gen._M_x[0x108]._4_4_,(int)master.mt_gen._M_x[0x108],
                      (CreateBlock *)master.mt_gen._M_x[0x107],
                      (DestroyBlock *)master.mt_gen._M_x[0x106],
                      (ExternalStorage *)master.mt_gen._M_x[0x10c],
                      (SaveBlock *)master.mt_gen._M_x[0x10d],(LoadBlock *)master.mt_gen._M_x[0x10e],
                      (QueuePolicy *)master.mt_gen._M_x[0x10f]);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
            ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x10dde1);
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
            ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x10ddee);
  std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x10ddfb);
  std::function<void_*()>::~function((function<void_*()> *)0x10de08);
  diy::mpi::communicator::~communicator((communicator *)0x10de15);
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  diy::mpi::communicator::size(&local_30);
  diy::RoundRobinAssigner::Assigner
            ((RoundRobinAssigner *)this_02,(int)((ulong)block >> 0x20),(int)block);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10de65);
  diy::mpi::communicator::rank(&local_30);
  diy::RoundRobinAssigner::local_gids
            (in_stack_ffffffffffffe5c0,iVar6,(vector<int,_std::allocator<int>_> *)this);
  local_1808 = 0;
  while( true ) {
    uVar1 = local_1808;
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_1800);
    if (sVar4 <= uVar1) break;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_1800,local_1808);
    local_180c = *pvVar5;
    this_00 = (Master *)operator_new(0x20);
    diy::Link::Link((Link *)this_02);
    local_1818.data = (MPI_Comm)this_00;
    if (local_180c < local_e8 + -1) {
      local_1820 = local_180c + 1;
      in_stack_ffffffffffffe61c =
           diy::RoundRobinAssigner::rank((RoundRobinAssigner *)this_02,(int)((ulong)block >> 0x20));
      local_181c = in_stack_ffffffffffffe61c;
      diy::Link::add_neighbor((Link *)this_02,block);
    }
    if (0 < local_180c) {
      local_1820 = local_180c + -1;
      local_181c = diy::RoundRobinAssigner::rank
                             ((RoundRobinAssigner *)this_02,(int)((ulong)block >> 0x20));
      diy::Link::add_neighbor((Link *)this_02,block);
    }
    vVar7 = local_180c;
    this_01 = (Block *)operator_new(4);
    Block::Block(this_01);
    diy::Master::add(this_00,in_stack_ffffffffffffe61c,this_01,
                     (Link *)CONCAT44(vVar7,in_stack_ffffffffffffe608));
    local_1808 = local_1808 + 1;
  }
  local_1824 = 2;
  for (local_1828 = 0; remote_00 = (undefined1)((ulong)in_stack_ffffffffffffe688 >> 0x38),
      iVar6 = (int)((ulong)block >> 0x20), local_1828 < local_1824; local_1828 = local_1828 + 1) {
    local_1830 = enq;
    std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>(this,__f);
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (in_stack_ffffffffffffe5e0,
               (_func_void_Block_ptr_ProxyWithLink_ptr **)
               CONCAT44(in_stack_ffffffffffffe5dc,in_stack_ffffffffffffe5d8),
               in_stack_ffffffffffffe5d0);
    std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x10e229);
    local_1868 = (pointer)0x0;
    _Stack_1860._0_8_ = 0;
    local_1878 = (pointer)0x0;
    piStack_1870 = (pointer)0x0;
    _Stack_18a0.__data.__list.__prev = (__pthread_internal_list *)0x0;
    _Stack_18a0.__data.__list.__next = (__pthread_internal_list *)0x0;
    _Stack_18a0._8_8_ = 0;
    _Stack_18a0._16_8_ = 0;
    local_18a8 = (_Base_ptr)0x0;
    _Stack_18a0.__align = 0;
    local_18b8 = (pointer)0x0;
    p_Stack_18b0 = (_Base_ptr)0x0;
    diy::MemoryManagement::MemoryManagement((MemoryManagement *)this_02);
    diy::Master::exchange
              (in_stack_ffffffffffffe690,(bool)remote_00,
               (MemoryManagement *)in_stack_ffffffffffffe680);
    diy::MemoryManagement::~MemoryManagement((MemoryManagement *)this_02);
    local_18e0._32_8_ = deq;
    in_stack_ffffffffffffe5f0 = (FileStorage *)local_18e0;
    std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>(this,__f);
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (in_stack_ffffffffffffe5e0,
               (_func_void_Block_ptr_ProxyWithLink_ptr **)
               CONCAT44(in_stack_ffffffffffffe5dc,in_stack_ffffffffffffe5d8),
               in_stack_ffffffffffffe5d0);
    std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x10e2e3);
    local_18f0 = local_17e8;
    in_stack_ffffffffffffe5e8 = &local_1910;
    std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>(this,__f);
    diy::Master::foreach<main::__0>
              (in_stack_ffffffffffffe5e0,
               (anon_class_8_1_d1e0335a *)
               CONCAT44(in_stack_ffffffffffffe5dc,in_stack_ffffffffffffe5d8),
               in_stack_ffffffffffffe5d0);
    std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x10e336);
    in_stack_ffffffffffffe5dc = 1;
    in_stack_ffffffffffffe688 = (pointer)0x0;
    in_stack_ffffffffffffe690 = (Master *)0x0;
    in_stack_ffffffffffffe5e0 = (Master *)&stack0xffffffffffffe688;
    diy::MemoryManagement::MemoryManagement((MemoryManagement *)this_02);
    diy::Master::exchange
              (in_stack_ffffffffffffe690,SUB81((ulong)in_stack_ffffffffffffe688 >> 0x38,0),
               (MemoryManagement *)in_stack_ffffffffffffe680);
    diy::MemoryManagement::~MemoryManagement((MemoryManagement *)this_02);
    in_stack_ffffffffffffe680 = remote_deq;
    in_stack_ffffffffffffe5d0 = &local_19a0;
    std::function<bool(int,diy::Master_const&)>::function<diy::Master::NeverSkip,void>(this,__f);
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (in_stack_ffffffffffffe5e0,
               (_func_void_Block_ptr_ProxyWithLink_ptr **)
               CONCAT44(in_stack_ffffffffffffe5dc,in_stack_ffffffffffffe5d8),
               in_stack_ffffffffffffe5d0);
    std::function<bool_(int,_const_diy::Master_&)>::~function
              ((function<bool_(int,_const_diy::Master_&)> *)0x10e409);
  }
  iVar2 = diy::mpi::communicator::rank(&local_30);
  if (iVar2 == 0) {
    diy::Master::loaded_block((Master *)0x10e53b);
    diy::Master::block<Block>(this_02,iVar6);
    fmt::v7::print<char[22],int&,char>
              ((FILE *)in_stack_ffffffffffffe5e8,(char (*) [22])in_stack_ffffffffffffe5e0,
               (int *)CONCAT44(in_stack_ffffffffffffe5dc,in_stack_ffffffffffffe5d8));
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  diy::RoundRobinAssigner::~RoundRobinAssigner((RoundRobinAssigner *)0x10e58d);
  diy::Master::~Master(this_02);
  diy::FileStorage::~FileStorage(in_stack_ffffffffffffe5f0);
  diy::mpi::communicator::~communicator((communicator *)0x10e5b4);
  diy::mpi::environment::~environment((environment *)0x10e5c1);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
//     diy::create_logger("trace");

    diy::mpi::environment     env(argc, argv);
    diy::mpi::communicator    world;
    diy::FileStorage          storage("./DIY.XXXXXX");
    int                       nblocks    = 24 * world.size();
//     int                       threads    = 1;
    int                       threads    = 2;
    int                       mem_blocks = -1;

    diy::Master               master(world,
                                     threads,
                                     mem_blocks,
                                     &create_block,
                                     &destroy_block,
                                     &storage,
                                     &save_block,
                                     &load_block);

    srand(static_cast<unsigned int>(time(NULL)));

    diy::RoundRobinAssigner   assigner(world.size(), nblocks);

    // this example creates a linear chain of blocks with links between adjacent blocks
    std::vector<int> gids;                     // global ids of local blocks
    assigner.local_gids(world.rank(), gids);   // get the gids of local blocks
    for (size_t i = 0; i < gids.size(); ++i)   // for the local blocks in this processor
    {
        int gid = gids[i];

        diy::Link*   link = new diy::Link;   // link is this block's neighborhood
        diy::BlockID neighbor;               // one neighbor in the neighborhood
        if (gid < nblocks - 1)               // RH neighbors for all but the last block in the global domain
        {
            neighbor.gid  = gid + 1;                     // gid of the neighbor block
            neighbor.proc = assigner.rank(neighbor.gid); // process of the neighbor block
            link->add_neighbor(neighbor);                // add the neighbor block to the link
        }
        if (gid > 0)                         // LH neighbors for all but the first block in the global domain
        {
            neighbor.gid  = gid - 1;
            neighbor.proc = assigner.rank(neighbor.gid);
            link->add_neighbor(neighbor);
        }

        master.add(gid, new Block, link);    // add the current local block to the master
    }

    int num_iters = 2;
    for (int i = 0; i < num_iters; i++)
    {
        // exchange some data inside the links
        master.foreach(&enq);
        master.exchange();
        master.foreach(&deq);

        // (remote) exchange some data outside the links
        master.foreach([&](Block* b, const diy::Master::ProxyWithLink& cp)
                { remote_enq(b, cp, assigner); });
        bool remote = true;
        master.exchange(remote);
        master.foreach(&remote_deq);
    }

    if (world.rank() == 0)
        fmt::print(stderr,
                   "Total iterations: {}\n", master.block<Block>(master.loaded_block())->count);

}